

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O3

void sysbvm_jit_dumpCodeToFileNamed(void *code,size_t codeSize,char *fileName)

{
  FILE *__s;
  
  __s = fopen(fileName,"wb");
  if (__s != (FILE *)0x0) {
    fwrite(code,codeSize,1,__s);
    fclose(__s);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_dumpCodeToFileNamed(const void *code, size_t codeSize, const char *fileName)
{
#ifdef _WIN32
    FILE *file = NULL;
    fopen_s(&file, fileName, "wb");
#else
    FILE *file = fopen(fileName, "wb");
#endif
    if(!file)
        return;

    (void)fwrite(code, codeSize, 1, file);
    fclose(file);
}